

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbiscan.cpp
# Opt level: O2

void __thiscall
icu_63::RBBIRuleScanner::findSetFor
          (RBBIRuleScanner *this,UnicodeString *s,RBBINode *node,UnicodeSet *setToAdopt)

{
  int8_t iVar1;
  uint start;
  void *pvVar2;
  RBBINode *this_00;
  undefined8 *buffer;
  UnicodeString *pUVar3;
  RBBINode *p;
  UnicodeString *size;
  ConstChar16Ptr local_48 [3];
  
  size = (UnicodeString *)local_48;
  pUVar3 = s;
  pvVar2 = uhash_get_63(this->fSetTable,s);
  if (pvVar2 != (void *)0x0) {
    if (setToAdopt != (UnicodeSet *)0x0) {
      UnicodeSet::~UnicodeSet(setToAdopt);
    }
    UMemory::operator_delete((UMemory *)setToAdopt,pUVar3);
    node->fLeftChild = *(RBBINode **)((long)pvVar2 + 8);
    return;
  }
  if (setToAdopt == (UnicodeSet *)0x0) {
    local_48[0].p_ = L"any";
    iVar1 = UnicodeString::compare(s,local_48,-1);
    local_48[1].p_ = local_48[0].p_;
    if (iVar1 == '\0') {
      setToAdopt = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)size);
      pUVar3 = size;
      if (setToAdopt != (UnicodeSet *)0x0) {
        pUVar3 = (UnicodeString *)0x0;
        UnicodeSet::UnicodeSet(setToAdopt,0,0x10ffff);
        goto LAB_00288cb2;
      }
    }
    else {
      pUVar3 = (UnicodeString *)0x0;
      start = UnicodeString::char32At(s,0);
      setToAdopt = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pUVar3);
      if (setToAdopt != (UnicodeSet *)0x0) {
        pUVar3 = (UnicodeString *)(ulong)start;
        UnicodeSet::UnicodeSet(setToAdopt,start,start);
        goto LAB_00288cb2;
      }
    }
    setToAdopt = (UnicodeSet *)0x0;
  }
LAB_00288cb2:
  this_00 = (RBBINode *)UMemory::operator_new((UMemory *)0xa0,(size_t)pUVar3);
  if (this_00 != (RBBINode *)0x0) {
    RBBINode::RBBINode(this_00,uset);
    this_00->fInputSet = setToAdopt;
    this_00->fParent = node;
    node->fLeftChild = this_00;
    UnicodeString::operator=(&this_00->fText,s);
    p = this_00;
    UVector::addElement(this->fRB->fUSetNodes,this_00,this->fRB->fStatus);
    buffer = (undefined8 *)uprv_malloc_63(0x10);
    pUVar3 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)p);
    if (pUVar3 != (UnicodeString *)0x0) {
      UnicodeString::UnicodeString(pUVar3,s);
      p = (RBBINode *)s;
    }
    if (((setToAdopt != (UnicodeSet *)0x0) && (buffer != (undefined8 *)0x0)) &&
       (pUVar3 != (UnicodeString *)0x0)) {
      *buffer = pUVar3;
      buffer[1] = this_00;
      uhash_put_63(this->fSetTable,pUVar3,buffer,this->fRB->fStatus);
      return;
    }
    if (pUVar3 != (UnicodeString *)0x0) {
      (*(pUVar3->super_Replaceable).super_UObject._vptr_UObject[1])(pUVar3);
    }
    uprv_free_63(buffer);
    if (setToAdopt != (UnicodeSet *)0x0) {
      UnicodeSet::~UnicodeSet(setToAdopt);
    }
    UMemory::operator_delete((UMemory *)setToAdopt,p);
  }
  error(this,U_MEMORY_ALLOCATION_ERROR);
  return;
}

Assistant:

void RBBIRuleScanner::findSetFor(const UnicodeString &s, RBBINode *node, UnicodeSet *setToAdopt) {

    RBBISetTableEl   *el;

    // First check whether we've already cached a set for this string.
    // If so, just use the cached set in the new node.
    //   delete any set provided by the caller, since we own it.
    el = (RBBISetTableEl *)uhash_get(fSetTable, &s);
    if (el != NULL) {
        delete setToAdopt;
        node->fLeftChild = el->val;
        U_ASSERT(node->fLeftChild->fType == RBBINode::uset);
        return;
    }

    // Haven't seen this set before.
    // If the caller didn't provide us with a prebuilt set,
    //   create a new UnicodeSet now.
    if (setToAdopt == NULL) {
        if (s.compare(kAny, -1) == 0) {
            setToAdopt = new UnicodeSet(0x000000, 0x10ffff);
        } else {
            UChar32 c;
            c = s.char32At(0);
            setToAdopt = new UnicodeSet(c, c);
        }
    }

    //
    // Make a new uset node to refer to this UnicodeSet
    // This new uset node becomes the child of the caller's setReference node.
    //
    RBBINode *usetNode    = new RBBINode(RBBINode::uset);
    if (usetNode == NULL) {
        error(U_MEMORY_ALLOCATION_ERROR);
        return;
    }
    usetNode->fInputSet   = setToAdopt;
    usetNode->fParent     = node;
    node->fLeftChild      = usetNode;
    usetNode->fText = s;


    //
    // Add the new uset node to the list of all uset nodes.
    //
    fRB->fUSetNodes->addElement(usetNode, *fRB->fStatus);


    //
    // Add the new set to the set hash table.
    //
    el      = (RBBISetTableEl *)uprv_malloc(sizeof(RBBISetTableEl));
    UnicodeString *tkey = new UnicodeString(s);
    if (tkey == NULL || el == NULL || setToAdopt == NULL) {
        // Delete to avoid memory leak
        delete tkey;
        tkey = NULL;
        uprv_free(el);
        el = NULL;
        delete setToAdopt;
        setToAdopt = NULL;

        error(U_MEMORY_ALLOCATION_ERROR);
        return;
    }
    el->key = tkey;
    el->val = usetNode;
    uhash_put(fSetTable, el->key, el, fRB->fStatus);

    return;
}